

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

void abgr_f32_to_bgr_555(void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy
                        ,int width,int height)

{
  ushort *puVar1;
  ushort *puVar2;
  float *pfVar3;
  int iVar4;
  int iVar5;
  
  if (0 < height) {
    puVar2 = (ushort *)((long)dst + (long)dx * 2 + (long)(dy * dst_pitch));
    pfVar3 = (float *)((long)src + (long)(sy * src_pitch) + (long)sx * 0x10);
    iVar4 = src_pitch + 0xf;
    if (-1 < src_pitch) {
      iVar4 = src_pitch;
    }
    iVar5 = 0;
    do {
      if (0 < width) {
        puVar1 = puVar2 + width;
        do {
          *puVar2 = (ushort)(long)(*pfVar3 * 31.0) |
                    (ushort)((int)(long)(pfVar3[1] * 31.0) << 5) |
                    (ushort)((int)(long)(pfVar3[2] * 31.0) << 10);
          puVar2 = puVar2 + 1;
          pfVar3 = pfVar3 + 4;
        } while (puVar2 < puVar1);
      }
      pfVar3 = pfVar3 + (long)((iVar4 >> 4) - width) * 4;
      puVar2 = puVar2 + (dst_pitch / 2 - width);
      iVar5 = iVar5 + 1;
    } while (iVar5 != height);
  }
  return;
}

Assistant:

static void abgr_f32_to_bgr_555(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const ALLEGRO_COLOR *src_ptr = (const ALLEGRO_COLOR *)((const char *)src + sy * src_pitch);
   uint16_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 16 - width;
   int dst_gap = dst_pitch / 2 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint16_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_ABGR_F32_TO_BGR_555(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}